

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

void __thiscall
cppcms::applications_pool::_data::attachment::attachment
          (attachment *this,shared_ptr<cppcms::application_specific_pool> *p,mount_point *m)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  mount_point::mount_point(&this->mp,m);
  (this->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (p->super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var1 = (p->super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->pool).super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

attachment(booster::shared_ptr<application_specific_pool> p,mount_point const &m) : mp(m), pool(p) {}